

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::SystemInformationImplementation::RunMemoryCheck(SystemInformationImplementation *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  long lVar6;
  uint uVar7;
  bool bVar8;
  undefined4 uStack_628;
  undefined2 uStack_624;
  undefined2 uStack_622;
  long lStack_620;
  ulong uStack_618;
  ulong uStack_610;
  ulong uStack_608;
  long lStack_600;
  ulong auStack_5f8 [4];
  ulong uStack_5d8;
  ulong uStack_5d0;
  utsname uStack_5be;
  char acStack_438 [1032];
  
  uVar7 = 0;
  uStack_608 = 0;
  uStack_610 = 0;
  uStack_618 = 0;
  lStack_620 = 0;
  iVar1 = uname(&uStack_5be);
  if (iVar1 == 0) {
    sVar5 = strlen(uStack_5be.release);
    bVar8 = false;
    if (2 < sVar5) {
      uVar7 = 0;
      if ((int)uStack_5be.release[0] - 0x30U < 10) {
        uVar7 = (int)uStack_5be.release[0] - 0x30U;
      }
      bVar8 = '5' < uStack_5be.release[2] && (int)uStack_5be.release[2] - 0x30U < 10;
    }
    __stream = fopen("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      if ((2 < (int)uVar7) || ((bool)(uVar7 == 2 & bVar8))) {
        uStack_624 = 0;
        uStack_628 = 0;
        pcVar4 = fgets(acStack_438,0x400,__stream);
        bVar8 = false;
        if (pcVar4 != (char *)0x0) {
          lVar6 = 0;
          iVar1 = 0;
          do {
            do {
              if ((*(char *)((long)&uStack_628 + lVar6) == '\0') &&
                 (iVar2 = __isoc99_sscanf(acStack_438,
                                          (long)&DAT_005505d8 + (long)(int)(&DAT_005505d8)[lVar6],
                                          auStack_5f8 + lVar6), iVar2 == 1)) {
                *(undefined1 *)((long)&uStack_628 + lVar6) = 1;
                iVar1 = iVar1 + 1;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 6);
            pcVar4 = fgets(acStack_438,0x400,__stream);
            lVar6 = 0;
          } while (pcVar4 != (char *)0x0);
          bVar8 = iVar1 == 6;
        }
        if (!bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Problem parsing /proc/meminfo",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          fclose(__stream);
          return;
        }
        this->TotalPhysicalMemory = auStack_5f8[0] >> 10;
        this->AvailablePhysicalMemory = auStack_5f8[2] + auStack_5f8[1] + auStack_5f8[3] >> 10;
        this->TotalVirtualMemory = uStack_5d8 >> 10;
        this->AvailableVirtualMemory = uStack_5d0 >> 10;
      }
      else {
        pcVar4 = fgets(acStack_438,0x400,__stream);
        iVar1 = 0;
        if (pcVar4 == acStack_438) {
          iVar1 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&uStack_610,auStack_5f8,
                                  &lStack_620,auStack_5f8,&lStack_600,&uStack_628);
        }
        if (iVar1 == 6) {
          iVar1 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&uStack_608,auStack_5f8,&uStack_618
                                 );
          iVar1 = iVar1 + 6;
        }
        if (iVar1 != 9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Problem parsing /proc/meminfo",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          fclose(__stream);
          return;
        }
        this->TotalVirtualMemory = uStack_608 >> 0x14;
        this->TotalPhysicalMemory = uStack_610 >> 0x14;
        this->AvailableVirtualMemory = uStack_618 >> 0x14;
        this->AvailablePhysicalMemory =
             (ulong)(lStack_600 + lStack_620 + CONCAT26(uStack_622,CONCAT24(uStack_624,uStack_628)))
             >> 0x14;
      }
      fclose(__stream);
      return;
    }
    pcVar4 = "Problem opening /proc/meminfo";
    sVar5 = 0x1d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem calling uname(): ",0x19);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x68d758);
      goto LAB_003e6c8a;
    }
    sVar5 = strlen(pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
LAB_003e6c8a:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void SystemInformationImplementation::RunMemoryCheck()
{
#if defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisMemory();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXMemory();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDMemory();
#elif defined(__CYGWIN__)
  this->QueryCygwinMemory();
#elif defined(_WIN32)
  this->QueryWindowsMemory();
#elif defined(__hpux)
  this->QueryHPUXMemory();
#elif defined(__linux)
  this->QueryLinuxMemory();
#elif defined(_AIX)
  this->QueryAIXMemory();
#else
  this->QueryMemory();
#endif
}